

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

ModuleScope * __thiscall
capnp::compiler::Compiler::add(ModuleScope *__return_storage_ptr__,Compiler *this,Module *module)

{
  uint64_t uVar1;
  CompiledModule *pCVar2;
  
  kj::_::Mutex::lock(&(this->impl).mutex,0);
  pCVar2 = Impl::addInternal((this->impl).value.ptr,module);
  kj::_::Mutex::unlock(&(this->impl).mutex,EXCLUSIVE,(Waiter *)0x0);
  uVar1 = (pCVar2->rootNode).id;
  __return_storage_ptr__->compiler = this;
  __return_storage_ptr__->id = uVar1;
  __return_storage_ptr__->node = &pCVar2->rootNode;
  return __return_storage_ptr__;
}

Assistant:

Compiler::ModuleScope Compiler::add(Module& module) const {
  Node& root = impl.lockExclusive()->get()->addInternal(module).getRootNode();
  return ModuleScope(*this, root.getId(), root);
}